

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O1

void __thiscall n_e_s::core::Pipeline::clear(Pipeline *this)

{
  if ((this->steps_).
      super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (this->steps_).
      super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      std::
      deque<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
      ::pop_front(&this->steps_);
    } while ((this->steps_).
             super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             (this->steps_).
             super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  this->continue_ = true;
  return;
}

Assistant:

void Pipeline::clear() {
    while (!steps_.empty()) {
        steps_.pop_front();
    }
    continue_ = true;
}